

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void dequant_comp(j_decompress_ptr cinfo,jpeg_component_info *compptr,jvirt_barray_ptr coef_array,
                 JQUANT_TBL *qtblptr1)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  JQUANT_TBL *pJVar4;
  JBLOCKARRAY ppaJVar5;
  ulong uVar6;
  JDIMENSION JVar7;
  ulong uVar8;
  JBLOCKROW paJVar9;
  ulong uVar10;
  long lVar11;
  
  if (compptr->height_in_blocks != 0) {
    pJVar4 = compptr->quant_table;
    uVar6 = (ulong)(uint)compptr->v_samp_factor;
    JVar7 = 0;
    do {
      ppaJVar5 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,coef_array,JVar7,(JDIMENSION)uVar6,1);
      iVar2 = compptr->v_samp_factor;
      uVar6 = (ulong)iVar2;
      if (0 < (long)uVar6) {
        uVar3 = compptr->width_in_blocks;
        uVar8 = 0;
        do {
          if ((ulong)uVar3 != 0) {
            paJVar9 = ppaJVar5[uVar8];
            uVar10 = 0;
            do {
              lVar11 = 0;
              do {
                uVar1 = pJVar4->quantval[lVar11];
                if (uVar1 != qtblptr1->quantval[lVar11]) {
                  (*paJVar9)[lVar11] = (uVar1 / qtblptr1->quantval[lVar11]) * (*paJVar9)[lVar11];
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x40);
              uVar10 = uVar10 + 1;
              paJVar9 = paJVar9 + 1;
            } while (uVar10 != uVar3);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar6);
      }
      JVar7 = JVar7 + iVar2;
    } while (JVar7 < compptr->height_in_blocks);
  }
  return;
}

Assistant:

LOCAL(void)
dequant_comp(j_decompress_ptr cinfo, jpeg_component_info *compptr,
             jvirt_barray_ptr coef_array, JQUANT_TBL *qtblptr1)
{
  JDIMENSION blk_x, blk_y;
  int offset_y, k;
  JQUANT_TBL *qtblptr;
  JBLOCKARRAY buffer;
  JBLOCKROW block;
  JCOEFPTR ptr;

  qtblptr = compptr->quant_table;
  for (blk_y = 0; blk_y < compptr->height_in_blocks;
       blk_y += compptr->v_samp_factor) {
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef_array, blk_y,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
      block = buffer[offset_y];
      for (blk_x = 0; blk_x < compptr->width_in_blocks; blk_x++) {
        ptr = block[blk_x];
        for (k = 0; k < DCTSIZE2; k++)
          if (qtblptr->quantval[k] != qtblptr1->quantval[k])
            ptr[k] *= qtblptr->quantval[k] / qtblptr1->quantval[k];
      }
    }
  }
}